

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_file_client.cpp
# Opt level: O0

void __thiscall SendFile::Send(SendFile *this,Handle *handle)

{
  byte bVar1;
  uint uVar2;
  element_type *peVar3;
  undefined1 local_1018 [4];
  int len;
  char buf [4096];
  Handle *handle_local;
  SendFile *this_local;
  
  buf._4088_8_ = handle;
  do {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      return;
    }
    std::istream::read((char *)this,(long)local_1018);
    uVar2 = std::istream::gcount();
    peVar3 = std::__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)buf._4088_8_);
    uVar2 = (*peVar3->_vptr_CNSocket[5])(peVar3,local_1018,(ulong)uVar2);
  } while ((uVar2 & 1) != 0);
  this->_block = true;
  return;
}

Assistant:

void Send(const Handle& handle) {
        char buf[__read_len];
        while (!_file.eof()) {
            _file.read(buf, __read_len);
            int len =  (int)_file.gcount();
            if (!handle->Write(buf, len)) {
                _block = true;
                return;
            }
        }
    }